

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  
  if (src != end) {
    do {
      if ((long)end - (long)src < 2) {
        return 0x32;
      }
      ppVar1 = *candidates;
      if (ppVar1 != (ptls_cipher_suite_t *)0x0) {
        pppVar2 = candidates + 1;
        do {
          if (ppVar1->id == (uint16_t)(*(ushort *)src << 8 | *(ushort *)src >> 8)) {
            *selected = ppVar1;
            return 0;
          }
          ppVar1 = *pppVar2;
          pppVar2 = pppVar2 + 1;
        } while (ppVar1 != (ptls_cipher_suite_t *)0x0);
      }
      src = (uint8_t *)((long)src + 2);
    } while (src != end);
  }
  return 0x28;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end)
{
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        ptls_cipher_suite_t **c = candidates;
        for (; *c != NULL; ++c) {
            if ((*c)->id == id) {
                *selected = *c;
                return 0;
            }
        }
    }

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}